

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateAccel.cpp
# Opt level: O0

bool __thiscall CalibrateAccel::CalculateMean(CalibrateAccel *this,Vector3d *Mean)

{
  double dVar1;
  bool bVar2;
  Scalar *pSVar3;
  long in_RDI;
  exception *e;
  Matrix<double,_3,_1,_0,_3,_1> data;
  iterator __end2;
  iterator __begin2;
  VecVector3d *__range2;
  int i;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff28;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff30;
  Scalar *in_stack_ffffffffffffff38;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_ffffffffffffff40;
  Scalar *in_stack_ffffffffffffff58;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff60;
  __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_50;
  long local_48;
  int local_1c;
  
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    Eigen::Matrix<double,3,1,0,3,1>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_48 = in_RDI + (long)local_1c * 0x18;
    local_50._M_current =
         (Matrix<double,_3,_1,_0,_3,_1> *)
         std::
         vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ::begin((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_ffffffffffffff28);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::end((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)in_stack_ffffffffffffff28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
      ::operator*(&local_50);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (in_stack_ffffffffffffff30,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff28);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff60 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      *pSVar3 = *pSVar3 + (double)in_stack_ffffffffffffff60;
      in_stack_ffffffffffffff58 =
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      dVar1 = *in_stack_ffffffffffffff58;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      *pSVar3 = *pSVar3 + dVar1;
      in_stack_ffffffffffffff40 =
           (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff30 = *(Matrix<double,_3,_1,_0,_3,_1> **)in_stack_ffffffffffffff40;
      in_stack_ffffffffffffff38 =
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff40,(Index)in_stack_ffffffffffffff38);
      *in_stack_ffffffffffffff38 = (double)in_stack_ffffffffffffff30 + *in_stack_ffffffffffffff38;
      __gnu_cxx::
      __normal_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
      ::operator++(&local_50);
    }
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)(in_RDI + (long)local_1c * 0x18));
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return true;
}

Assistant:

bool CalibrateAccel::CalculateMean(Vector3d* Mean)
{
    for(int i = 0; i < 6; ++i)
    {
        try
        {
            Mean[i] = Vector3d::Zero();
            for(auto data : this->Accel[i])
            {
                Mean[i][0] += data[0];
                Mean[i][1] += data[1];
                Mean[i][2] += data[2];
            }
            Mean[i] /= Accel[i].size();
        }
        catch(const std::exception& e)
        {
            std::cerr << e.what() << '\n';
            return false;
        }
    }

    return true;
}